

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_current.cpp
# Opt level: O1

void cpptrace::detail::perform_typeinfo_surgery(type_info *info,do_catch_fn *do_catch_function)

{
  long lVar1;
  int protections;
  void *__dest;
  runtime_error *prVar2;
  int *args;
  uint uVar3;
  void *page;
  int page_size;
  uint local_4c;
  string local_48;
  
  lVar1 = *(long *)info;
  local_4c = getpagesize();
  if ((int)local_4c < 1) {
    uVar3 = local_4c - (local_4c >> 1 & 0x55555555);
    uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333);
    uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f) * 0x1010101 >> 0x18;
    args = (int *)(ulong)uVar3;
    if (1 < uVar3) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      microfmt::format<int&>
                (&local_48,
                 (microfmt *)"getpagesize() is not a power of 2 greater than zero (was {})",
                 (char *)&local_4c,args);
      std::runtime_error::runtime_error(prVar2,(string *)&local_48);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __dest = allocate_page(local_4c);
  memcpy(__dest,(void *)(lVar1 + -0x10),0x58);
  *(do_catch_fn **)((long)__dest + 0x30) = do_catch_function;
  mprotect_page(__dest,local_4c,1);
  uVar3 = local_4c;
  page = (void *)((long)(int)-local_4c & (ulong)info);
  if (info + (8 - (long)page) <= (type_info *)(ulong)local_4c) {
    protections = get_page_protections(page);
    mprotect_page(page,uVar3,3);
    *(long *)info = (long)__dest + 0x10;
    mprotect_page(page,local_4c,protections);
    return;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,"pointer crosses page boundaries");
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void perform_typeinfo_surgery(const std::type_info& info, do_catch_fn* do_catch_function) {
            if(vtable_size == 0) { // set to zero if we don't know what standard library we're working with
                return;
            }
            void* type_info_pointer = const_cast<void*>(static_cast<const void*>(&info));
            void* type_info_vtable_pointer = *static_cast<void**>(type_info_pointer);
            // the type info vtable pointer points to two pointers inside the vtable, adjust it back
            type_info_vtable_pointer = static_cast<void*>(static_cast<void**>(type_info_vtable_pointer) - 2);

            // for libstdc++ the class type info vtable looks like
            // 0x7ffff7f89d18 <_ZTVN10__cxxabiv117__class_type_infoE>:    0x0000000000000000  0x00007ffff7f89d00
            //                                                            [offset           ][typeinfo pointer ]
            // 0x7ffff7f89d28 <_ZTVN10__cxxabiv117__class_type_infoE+16>: 0x00007ffff7dd65a0  0x00007ffff7dd65c0
            //                                                            [base destructor  ][deleting dtor    ]
            // 0x7ffff7f89d38 <_ZTVN10__cxxabiv117__class_type_infoE+32>: 0x00007ffff7dd8f10  0x00007ffff7dd8f10
            //                                                            [__is_pointer_p   ][__is_function_p  ]
            // 0x7ffff7f89d48 <_ZTVN10__cxxabiv117__class_type_infoE+48>: 0x00007ffff7dd6640  0x00007ffff7dd6500
            //                                                            [__do_catch       ][__do_upcast      ]
            // 0x7ffff7f89d58 <_ZTVN10__cxxabiv117__class_type_infoE+64>: 0x00007ffff7dd65e0  0x00007ffff7dd66d0
            //                                                            [__do_upcast      ][__do_dyncast     ]
            // 0x7ffff7f89d68 <_ZTVN10__cxxabiv117__class_type_infoE+80>: 0x00007ffff7dd6580  0x00007ffff7f8abe8
            //                                                            [__do_find_public_src][other         ]
            // In libc++ the layout is
            //  [offset           ][typeinfo pointer ]
            //  [base destructor  ][deleting dtor    ]
            //  [noop1            ][noop2            ]
            //  [can_catch        ][search_above_dst ]
            //  [search_below_dst ][has_unambiguous_public_base]
            // Relevant documentation/implementation:
            //  https://itanium-cxx-abi.github.io/cxx-abi/abi.html
            //  libstdc++
            //   https://github.com/gcc-mirror/gcc/blob/b13e34699c7d27e561fcfe1b66ced1e50e69976f/libstdc%252B%252B-v3/libsupc%252B%252B/typeinfo
            //   https://github.com/gcc-mirror/gcc/blob/b13e34699c7d27e561fcfe1b66ced1e50e69976f/libstdc%252B%252B-v3/libsupc%252B%252B/class_type_info.cc
            //  libc++
            //   https://github.com/llvm/llvm-project/blob/648f4d0658ab00cf1e95330c8811aaea9481a274/libcxx/include/typeinfo
            //   https://github.com/llvm/llvm-project/blob/648f4d0658ab00cf1e95330c8811aaea9481a274/libcxxabi/src/private_typeinfo.h

            // shouldn't be anything other than 4096 but out of an abundance of caution
            auto page_size = get_page_size();
            if(page_size <= 0 && (page_size & (page_size - 1)) != 0) {
                throw std::runtime_error(
                    microfmt::format("getpagesize() is not a power of 2 greater than zero (was {})", page_size)
                );
            }

            // allocate a page for the new vtable so it can be made read-only later
            // the OS cleans this up, no cleanup done here for it
            void* new_vtable_page = allocate_page(page_size);
            // make our own copy of the vtable
            memcpy(new_vtable_page, type_info_vtable_pointer, vtable_size * sizeof(void*));
            // ninja in the custom __do_catch interceptor
            auto new_vtable = static_cast<void**>(new_vtable_page);
            new_vtable[6] = reinterpret_cast<void*>(do_catch_function);
            // make the page read-only
            mprotect_page(new_vtable_page, page_size, memory_readonly);

            // make the vtable pointer for unwind_interceptor's type_info point to the new vtable
            auto type_info_addr = reinterpret_cast<uintptr_t>(type_info_pointer);
            auto page_addr = type_info_addr & ~(page_size - 1);
            // make sure the memory we're going to set is within the page
            if(type_info_addr - page_addr + sizeof(void*) > static_cast<unsigned>(page_size)) {
                throw std::runtime_error("pointer crosses page boundaries");
            }
            auto old_protections = mprotect_page_and_return_old_protections(
                reinterpret_cast<void*>(page_addr),
                page_size,
                memory_readwrite
            );
            *static_cast<void**>(type_info_pointer) = static_cast<void*>(new_vtable + 2);
            mprotect_page(reinterpret_cast<void*>(page_addr), page_size, old_protections);
        }